

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf256.cpp
# Opt level: O0

void gf256_mul_mem_init(void)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  __m256i table_hi2;
  __m256i table_lo2;
  __m128i table_hi;
  __m128i table_lo;
  uchar x;
  int y;
  uint8_t *hi;
  uint8_t *lo;
  byte local_135;
  uint local_134;
  longlong lStack_30;
  longlong lStack_28;
  
  for (local_134 = 0; (int)local_134 < 0x100; local_134 = local_134 + 1) {
    for (local_135 = 0; uVar4 = m_SelfTestBuffers.B._8_8_, uVar3 = m_SelfTestBuffers.B._0_8_,
        uVar2 = m_SelfTestBuffers.A._8_8_, uVar1 = m_SelfTestBuffers.A._0_8_, local_135 < 0x10;
        local_135 = local_135 + 1) {
      m_SelfTestBuffers.A[local_135] =
           GF256Ctx.GF256_MUL_TABLE[(local_134 & 0xff) * 0x100 + (uint)local_135];
      m_SelfTestBuffers.B[local_135] =
           GF256Ctx.GF256_MUL_TABLE[(local_134 & 0xff) * 0x100 + (uint)(byte)(local_135 << 4)];
    }
    GF256Ctx.MM128.TABLE_LO_Y[(int)local_134][0] = m_SelfTestBuffers.A._0_8_;
    GF256Ctx.MM128.TABLE_LO_Y[(int)local_134][1] = uVar2;
    GF256Ctx.MM128.TABLE_HI_Y[(int)local_134][0] = uVar3;
    GF256Ctx.MM128.TABLE_HI_Y[(int)local_134][1] = uVar4;
    if ((CpuHasAVX2 & 1U) != 0) {
      lVar5 = (long)(int)local_134;
      GF256Ctx.MM256.TABLE_LO_Y[lVar5][0] = lStack_30;
      GF256Ctx.MM256.TABLE_LO_Y[lVar5][1] = lStack_28;
      GF256Ctx.MM256.TABLE_LO_Y[lVar5][2] = lStack_30;
      GF256Ctx.MM256.TABLE_LO_Y[lVar5][3] = lStack_28;
      lVar5 = (long)(int)local_134;
      GF256Ctx.MM256.TABLE_HI_Y[lVar5][0] = uVar1;
      GF256Ctx.MM256.TABLE_HI_Y[lVar5][1] = uVar2;
      GF256Ctx.MM256.TABLE_HI_Y[lVar5][2] = uVar1;
      GF256Ctx.MM256.TABLE_HI_Y[lVar5][3] = uVar2;
    }
  }
  return;
}

Assistant:

static void gf256_mul_mem_init()
{
    // Reuse aligned self test buffers to load table data
    uint8_t* lo = m_SelfTestBuffers.A;
    uint8_t* hi = m_SelfTestBuffers.B;

    for (int y = 0; y < 256; ++y)
    {
        // TABLE_LO_Y maps 0..15 to 8-bit partial product based on y.
        for (unsigned char x = 0; x < 16; ++x)
        {
            lo[x] = gf256_mul(x, static_cast<uint8_t>( y ));
            hi[x] = gf256_mul(x << 4, static_cast<uint8_t>( y ));
        }

#if defined(GF256_TRY_NEON)
        if (CpuHasNeon)
        {
            GF256Ctx.MM128.TABLE_LO_Y[y] = vld1q_u8(lo);
            GF256Ctx.MM128.TABLE_HI_Y[y] = vld1q_u8(hi);
        }
#elif !defined(GF256_TARGET_MOBILE)
        const GF256_M128 table_lo = _mm_loadu_si128((GF256_M128*)lo);
        const GF256_M128 table_hi = _mm_loadu_si128((GF256_M128*)hi);
        _mm_storeu_si128(GF256Ctx.MM128.TABLE_LO_Y + y, table_lo);
        _mm_storeu_si128(GF256Ctx.MM128.TABLE_HI_Y + y, table_hi);
# ifdef GF256_TRY_AVX2
        if (CpuHasAVX2)
        {
            const GF256_M256 table_lo2 = _mm256_broadcastsi128_si256(table_lo);
            const GF256_M256 table_hi2 = _mm256_broadcastsi128_si256(table_hi);
            _mm256_storeu_si256(GF256Ctx.MM256.TABLE_LO_Y + y, table_lo2);
            _mm256_storeu_si256(GF256Ctx.MM256.TABLE_HI_Y + y, table_hi2);
        }
# endif // GF256_TRY_AVX2
#endif // GF256_TARGET_MOBILE
    }
}